

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O2

void cvRescale(CVodeMem cv_mem)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  sunrealtype *psVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  
  psVar4 = cv_mem->cv_cvals;
  *psVar4 = cv_mem->cv_eta;
  uVar2 = cv_mem->cv_q;
  uVar5 = 0;
  uVar7 = 0;
  if (0 < (int)uVar2) {
    uVar7 = (ulong)uVar2;
  }
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    psVar4[uVar5 + 1] = cv_mem->cv_eta * psVar4[uVar5];
  }
  N_VScaleVectorArray(uVar2,psVar4,cv_mem->cv_zn + 1);
  if (cv_mem->cv_quadr != 0) {
    N_VScaleVectorArray(cv_mem->cv_q,cv_mem->cv_cvals,cv_mem->cv_znQ + 1);
  }
  iVar3 = cv_mem->cv_sensi;
  if ((iVar3 != 0) || (cv_mem->cv_quadr_sensi != 0)) {
    uVar5 = 1;
    uVar2 = cv_mem->cv_Ns;
    uVar8 = 0;
    uVar7 = 0;
    if (0 < (int)uVar2) {
      uVar7 = (ulong)uVar2;
    }
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      cv_mem->cv_cvals[uVar8] = cv_mem->cv_eta;
    }
    iVar6 = cv_mem->cv_q;
    lVar10 = 0;
    iVar9 = 0;
    if (0 < iVar6) {
      iVar9 = iVar6;
    }
    lVar1 = (long)(int)uVar2 * 8;
    for (; uVar8 = uVar7, lVar11 = lVar10, uVar5 != iVar9 + 1; uVar5 = uVar5 + 1) {
      while (uVar8 != 0) {
        *(double *)((long)cv_mem->cv_cvals + lVar1 + lVar11) =
             cv_mem->cv_eta * *(double *)((long)cv_mem->cv_cvals + lVar11);
        uVar8 = uVar8 - 1;
        lVar11 = lVar11 + 8;
      }
      lVar10 = lVar10 + lVar1;
    }
    if (iVar3 != 0) {
      lVar10 = 0;
      for (uVar5 = 1; uVar5 != iVar9 + 1; uVar5 = uVar5 + 1) {
        for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
          *(N_Vector *)((long)cv_mem->cv_Xvecs + uVar8 * 8 + lVar10) = cv_mem->cv_znS[uVar5][uVar8];
        }
        lVar10 = lVar10 + lVar1;
      }
      N_VScaleVectorArray(uVar2 * iVar6,cv_mem->cv_cvals,cv_mem->cv_Xvecs);
    }
  }
  if (cv_mem->cv_quadr_sensi != 0) {
    iVar3 = cv_mem->cv_q;
    lVar10 = 0;
    iVar6 = 0;
    if (0 < iVar3) {
      iVar6 = iVar3;
    }
    uVar2 = cv_mem->cv_Ns;
    uVar5 = 0;
    if (0 < (int)uVar2) {
      uVar5 = (ulong)uVar2;
    }
    for (uVar7 = 1; uVar7 != iVar6 + 1; uVar7 = uVar7 + 1) {
      for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
        *(N_Vector *)((long)cv_mem->cv_Xvecs + uVar8 * 8 + lVar10) = cv_mem->cv_znQS[uVar7][uVar8];
      }
      lVar10 = lVar10 + (long)(int)uVar2 * 8;
    }
    N_VScaleVectorArray(iVar3 * uVar2,cv_mem->cv_cvals,cv_mem->cv_Xvecs);
  }
  dVar12 = cv_mem->cv_hscale * cv_mem->cv_eta;
  cv_mem->cv_h = dVar12;
  cv_mem->cv_next_h = dVar12;
  cv_mem->cv_hscale = dVar12;
  cv_mem->cv_nscon = 0;
  return;
}

Assistant:

void cvRescale(CVodeMem cv_mem)
{
  int j;
  int is;

  /* compute scaling factors */
  cv_mem->cv_cvals[0] = cv_mem->cv_eta;
  for (j = 1; j <= cv_mem->cv_q; j++)
  {
    cv_mem->cv_cvals[j] = cv_mem->cv_eta * cv_mem->cv_cvals[j - 1];
  }

  (void)N_VScaleVectorArray(cv_mem->cv_q, cv_mem->cv_cvals, cv_mem->cv_zn + 1,
                            cv_mem->cv_zn + 1);

  if (cv_mem->cv_quadr)
  {
    (void)N_VScaleVectorArray(cv_mem->cv_q, cv_mem->cv_cvals,
                              cv_mem->cv_znQ + 1, cv_mem->cv_znQ + 1);
  }

  /* compute sensi scaling factors */
  if (cv_mem->cv_sensi || cv_mem->cv_quadr_sensi)
  {
    for (is = 0; is < cv_mem->cv_Ns; is++)
    {
      cv_mem->cv_cvals[is] = cv_mem->cv_eta;
    }
    for (j = 1; j <= cv_mem->cv_q; j++)
    {
      for (is = 0; is < cv_mem->cv_Ns; is++)
      {
        cv_mem->cv_cvals[j * cv_mem->cv_Ns + is] =
          cv_mem->cv_eta * cv_mem->cv_cvals[(j - 1) * cv_mem->cv_Ns + is];
      }
    }
  }

  if (cv_mem->cv_sensi)
  {
    for (j = 1; j <= cv_mem->cv_q; j++)
    {
      for (is = 0; is < cv_mem->cv_Ns; is++)
      {
        cv_mem->cv_Xvecs[(j - 1) * cv_mem->cv_Ns + is] = cv_mem->cv_znS[j][is];
      }
    }

    (void)N_VScaleVectorArray(cv_mem->cv_q * cv_mem->cv_Ns, cv_mem->cv_cvals,
                              cv_mem->cv_Xvecs, cv_mem->cv_Xvecs);
  }

  if (cv_mem->cv_quadr_sensi)
  {
    for (j = 1; j <= cv_mem->cv_q; j++)
    {
      for (is = 0; is < cv_mem->cv_Ns; is++)
      {
        cv_mem->cv_Xvecs[(j - 1) * cv_mem->cv_Ns + is] = cv_mem->cv_znQS[j][is];
      }
    }

    (void)N_VScaleVectorArray(cv_mem->cv_q * cv_mem->cv_Ns, cv_mem->cv_cvals,
                              cv_mem->cv_Xvecs, cv_mem->cv_Xvecs);
  }

  cv_mem->cv_h      = cv_mem->cv_hscale * cv_mem->cv_eta;
  cv_mem->cv_next_h = cv_mem->cv_h;
  cv_mem->cv_hscale = cv_mem->cv_h;
  cv_mem->cv_nscon  = 0;
}